

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void idwpt_per(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  long local_40;
  
  iVar4 = *(int *)(wt->entropy + 0x12) + *(int *)(wt->entropy + 0xe);
  iVar10 = *(int *)(wt->entropy + 0x12) + *(int *)(wt->entropy + 0xe) + 3;
  if (-1 < iVar4) {
    iVar10 = iVar4;
  }
  uVar2 = iVar10 >> 2;
  uVar8 = (len_cA + uVar2) - 1;
  if (0 < (int)uVar8) {
    iVar10 = len_cA + -1;
    lVar5 = (long)len_cA;
    lVar13 = -1;
    local_40 = -2;
    uVar7 = 0;
    do {
      X[local_40 + 2] = 0.0;
      local_40 = local_40 + 2;
      X[lVar13 + 2] = 0.0;
      lVar13 = lVar13 + 2;
      if (3 < iVar4) {
        dVar15 = 0.0;
        lVar14 = 0;
        lVar3 = 0;
        dVar16 = 0.0;
        lVar11 = 0;
        do {
          lVar12 = uVar7 + lVar3;
          if (lVar12 < lVar5 && -1 < lVar12) {
            lVar6 = *(long *)wt->length;
            pdVar9 = (double *)(lVar6 + lVar14);
LAB_00106a8b:
            lVar1 = *(long *)(wt->length + 2);
            dVar16 = dVar16 + *pdVar9 * cA[lVar12] + *(double *)(lVar1 + lVar14) * cD[lVar12];
            X[local_40] = dVar16;
            dVar15 = dVar15 + *(double *)(lVar6 + 8 + lVar14) * cA[lVar12] +
                              *(double *)(lVar1 + 8 + lVar14) * cD[lVar12];
            X[lVar13] = dVar15;
          }
          else {
            if (lVar12 < iVar4 / 2 + iVar10 && lVar5 <= lVar12) {
              lVar6 = *(long *)wt->length;
              pdVar9 = (double *)(lVar6 + lVar11 * 0x10);
              lVar12 = (uVar7 - lVar11) - lVar5;
              goto LAB_00106a8b;
            }
            if ((lVar12 < 0) && ((int)-uVar2 < lVar12)) {
              lVar6 = *(long *)wt->length;
              pdVar9 = (double *)(lVar6 + lVar11 * 0x10);
              lVar12 = (long)(len_cA + (int)lVar3);
              goto LAB_00106a8b;
            }
          }
          lVar11 = lVar11 + 1;
          lVar3 = lVar3 + -1;
          lVar14 = lVar14 + 0x10;
        } while (-(ulong)uVar2 != lVar3);
      }
      uVar7 = uVar7 + 1;
      len_cA = len_cA + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

static void idwpt_per(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, l2;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				X[m] += wt->wave->lpr[t] * cA[i - l - len_cA] + wt->wave->hpr[t] * cD[i - l - len_cA];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l - len_cA] + wt->wave->hpr[t + 1] * cD[i - l - len_cA];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				X[m] += wt->wave->lpr[t] * cA[len_cA + i - l] + wt->wave->hpr[t] * cD[len_cA + i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[len_cA + i - l] + wt->wave->hpr[t + 1] * cD[len_cA + i - l];
			}
		}
	}
}